

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

void __thiscall bssl::Vector<bssl::ALPSConfig>::~Vector(Vector<bssl::ALPSConfig> *this)

{
  clear(this);
  return;
}

Assistant:

~Vector() { clear(); }